

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

void Ssw_CheckConstraints(Ssw_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pOld;
  Aig_Obj_t *pNew;
  uint local_2c;
  int local_28;
  int Counter;
  int i;
  int nConstrPairs;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  local_2c = 0;
  iVar1 = Aig_ManCoNum(p->pFrames);
  iVar2 = Aig_ManRegNum(p->pAig);
  uVar3 = iVar1 - iVar2;
  if ((uVar3 & 1) == 0) {
    for (local_28 = 0; local_28 < (int)uVar3; local_28 = local_28 + 2) {
      pAVar4 = Aig_ManCo(p->pFrames,local_28);
      pAVar5 = Aig_ManCo(p->pFrames,local_28 + 1);
      pOld = Aig_ObjFanin0(pAVar4);
      pNew = Aig_ObjFanin0(pAVar5);
      iVar1 = Ssw_NodesAreEquiv(p,pOld,pNew);
      if (iVar1 != 1) {
        pAVar4 = Aig_ObjChild0(pAVar4);
        pAVar5 = Aig_ObjChild0(pAVar5);
        Ssw_NodesAreConstrained(p,pAVar4,pAVar5);
        local_2c = local_2c + 1;
      }
    }
    Abc_Print(1,"Total constraints = %d. Added constraints = %d.\n",
              (long)(int)uVar3 / 2 & 0xffffffff,(ulong)local_2c);
    return;
  }
  __assert_fail("(nConstrPairs & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                ,0x5a,"void Ssw_CheckConstraints(Ssw_Man_t *)");
}

Assistant:

void Ssw_CheckConstraints( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObj2;
    int nConstrPairs, i;
    int Counter = 0;
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        if ( Ssw_NodesAreEquiv( p, Aig_ObjFanin0(pObj), Aig_ObjFanin0(pObj2) ) != 1 )
        {
            Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
            Counter++;
        }
    }
    Abc_Print( 1, "Total constraints = %d. Added constraints = %d.\n", nConstrPairs/2, Counter );
}